

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O3

void __thiscall PSBTInput::Serialize<DataStream>(PSBTInput *this,DataStream *s)

{
  uint256 *__last;
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *pmVar1;
  uint uVar2;
  KeyOriginInfo hd_keypath;
  byte bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  uchar *puVar6;
  uint uVar7;
  type *xonly;
  _Rb_tree_header *p_Var8;
  long in_FS_OFFSET;
  VectorWriter s_value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_v;
  PSBTInput *pPVar9;
  _Base_ptr p_Var10;
  allocator_type aVar11;
  undefined7 uVar12;
  pointer puVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  undefined4 local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->non_witness_utxo).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = &::TX_NO_WITNESS.allow_witness;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)this;
    SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
              (s,(ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *)
                 &local_78);
  }
  if ((this->witness_utxo).nValue != -1) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
    SerializeToVector<DataStream,CTxOut>(s,&this->witness_utxo);
  }
  uVar2 = (this->final_script_sig).super_CScriptBase._size;
  uVar7 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar7 = uVar2;
  }
  if ((uVar7 == 0) &&
     ((this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    p_Var4 = (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(this->partial_sigs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var8) {
      do {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&p_Var4[1]._M_right;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x21;
        if ((*(byte *)&p_Var4[1]._M_right & 0xfe) != 2) {
          bVar3 = *(byte *)&p_Var4[1]._M_right - 4;
          if (bVar3 < 4) {
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = *(pointer *)(&DAT_00e3c9f0 + (ulong)bVar3 * 8);
          }
          else {
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
          }
        }
        SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                  (s,(CompactSizeWriter *)&stack0xffffffffffffff78,
                   (Span<const_unsigned_char> *)&local_78);
        DataStream::operator<<
                  (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var4 + 4));
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var8);
    }
    pPVar9 = this;
    if ((this->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged != false) {
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x3;
      SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
      SerializeToVector<DataStream,int>(s,(int *)&this->sighash_type);
    }
    uVar2 = (this->redeem_script).super_CScriptBase._size;
    uVar7 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar7 = uVar2;
    }
    if (uVar7 != 0) {
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x4;
      SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
      SerializeMany<DataStream,prevector<28u,unsigned_char,unsigned_int,int>>
                (s,&(this->redeem_script).super_CScriptBase);
    }
    uVar2 = (this->witness_script).super_CScriptBase._size;
    uVar7 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar7 = uVar2;
    }
    if (uVar7 != 0) {
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x5;
      SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
      SerializeMany<DataStream,prevector<28u,unsigned_char,unsigned_int,int>>
                (s,&(this->witness_script).super_CScriptBase);
    }
    SerializeHDKeypaths<DataStream>(s,&this->hd_keypaths,(CompactSizeWriter)0x6);
    p_Var4 = (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var8) {
      do {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(p_Var4 + 1);
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x14;
        SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                  (s,(CompactSizeWriter *)&stack0xffffffffffffff78,
                   (Span<const_unsigned_char> *)&local_78);
        DataStream::operator<<
                  (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var4[1]._M_right);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var8);
    }
    p_Var4 = (pPVar9->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(pPVar9->sha256_preimages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var8) {
      do {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(p_Var4 + 1);
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x20;
        SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                  (s,(CompactSizeWriter *)&stack0xffffffffffffff78,
                   (Span<const_unsigned_char> *)&local_78);
        DataStream::operator<<
                  (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var4 + 2));
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var8);
    }
    p_Var4 = (pPVar9->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(pPVar9->hash160_preimages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var8) {
      do {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(p_Var4 + 1);
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x14;
        SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                  (s,(CompactSizeWriter *)&stack0xffffffffffffff78,
                   (Span<const_unsigned_char> *)&local_78);
        DataStream::operator<<
                  (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var4[1]._M_right);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var8);
    }
    p_Var4 = (pPVar9->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(pPVar9->hash256_preimages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var8) {
      do {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(p_Var4 + 1);
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x20;
        SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                  (s,(CompactSizeWriter *)&stack0xffffffffffffff78,
                   (Span<const_unsigned_char> *)&local_78);
        DataStream::operator<<
                  (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var4 + 2));
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var8);
    }
    this = pPVar9;
    if ((pPVar9->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pPVar9->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      SerializeToVector<DataStream,unsigned_char>(s,"\x13\x14\x15\x16\x17\x18\x05\x06\a");
      DataStream::operator<<(s,&pPVar9->m_tap_key_sig);
    }
    for (p_Var4 = (pPVar9->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pPVar9->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header
        ; p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_7_ =
           (undefined7)
           ((ulong)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 8);
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,0x41);
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                 (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_78,
                 (undefined1 *)
                 ((long)&local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1));
      SerializeMany<DataStream,unsigned_char,XOnlyPubKey,uint256>
                (s,"\x14\x15\x16\x17\x18\x05\x06\a",(XOnlyPubKey *)(p_Var4 + 1),
                 (uint256 *)(p_Var4 + 2));
      DataStream::operator<<
                (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var4 + 3));
    }
    p_Var4 = (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &(this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var4 != p_Var10) {
      do {
        for (p_Var5 = p_Var4[2]._M_right; p_Var5 != (_Base_ptr)&p_Var4[2]._M_parent;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)(p_Var5 + 1);
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)p_Var5[1]._M_parent -
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
          WriteCompactSize<DataStream>
                    (s,(uint64_t)
                       ((long)&(((PSBTInput *)
                                local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish)->non_witness_utxo).
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 1));
          SerializeMany<DataStream,unsigned_char,Span<unsigned_char_const>>
                    (s,"\x15\x16\x17\x18\x05\x06\a",(Span<const_unsigned_char> *)&local_78);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )*(uchar **)(p_Var4 + 1),
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )p_Var4[1]._M_parent,(allocator_type *)&stack0xffffffffffffff78);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&local_78,(uchar *)&stack0xffffffffffffff78);
          DataStream::operator<<(s,&local_78);
          if ((_Base_ptr)
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
            operator_delete(local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while (p_Var4 != p_Var10);
    }
    p_Var4 = (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &(this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var4 != p_Var10) {
      do {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_78.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,0x21);
        std::vector<std::byte,zero_after_free_allocator<std::byte>>::
        _M_range_insert<std::byte_const*>
                  ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                   (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_78,
                   (undefined1 *)
                   ((long)&local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + 1));
        SerializeMany<DataStream,unsigned_char,XOnlyPubKey>
                  (s,"\x16\x17\x18\x05\x06\a",(XOnlyPubKey *)(p_Var4 + 1));
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        aVar11 = SUB81(&local_78,0);
        uVar12 = (undefined7)((ulong)&local_78 >> 8);
        puVar13 = (pointer)0x0;
        Serialize<VectorWriter,uint256,std::less<uint256>,std::allocator<uint256>>
                  ((VectorWriter *)&stack0xffffffffffffff78,
                   (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)(p_Var4 + 2));
        local_58 = *(undefined4 *)&p_Var4[3]._M_left;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_50,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var4[3]._M_right);
        hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = &p_Var10->_M_color;
        hd_keypath._0_8_ = this;
        hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = aVar11;
        hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish._1_7_ = uVar12;
        hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar13;
        SerializeKeyOrigin<VectorWriter>((VectorWriter *)&stack0xffffffffffffff78,hd_keypath);
        if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_50.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        DataStream::operator<<(s,&local_78);
        if ((_Base_ptr)
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
          operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while (p_Var4 != p_Var10);
    }
    __last = &this->m_tap_merkle_root;
    puVar6 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (&this->m_tap_internal_key,__last);
    if ((uint256 *)puVar6 != __last) {
      SerializeToVector<DataStream,unsigned_char>(s,"\x17\x18\x05\x06\a");
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                 (uchar *)&this->m_tap_internal_key,(uchar *)__last,
                 (allocator_type *)&stack0xffffffffffffff78);
      DataStream::operator<<(s,&local_78);
      if ((_Base_ptr)
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    pmVar1 = &this->unknown;
    puVar6 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (__last,pmVar1);
    if ((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)puVar6 != pmVar1) {
      SerializeToVector<DataStream,unsigned_char>(s,"\x18\x05\x06\a");
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                 (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_78);
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                 (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,__last,pmVar1);
    }
  }
  uVar2 = (this->final_script_sig).super_CScriptBase._size;
  uVar7 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar7 = uVar2;
  }
  if (uVar7 != 0) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
    SerializeMany<DataStream,prevector<28u,unsigned_char,unsigned_int,int>>
              (s,&(this->final_script_sig).super_CScriptBase);
  }
  if ((this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = &DAT_00000008;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&local_78);
    SerializeToVector<DataStream,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              (s,&(this->final_script_witness).stack);
  }
  for (p_Var4 = (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    DataStream::operator<<(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var4 + 2));
    DataStream::operator<<
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var4[2]._M_right);
  }
  for (p_Var4 = (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->unknown)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    DataStream::operator<<(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var4 + 1));
    DataStream::operator<<
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var4[1]._M_right);
  }
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void Serialize(Stream& s) const {
        // Write the utxo
        if (non_witness_utxo) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_NON_WITNESS_UTXO));
            SerializeToVector(s, TX_NO_WITNESS(non_witness_utxo));
        }
        if (!witness_utxo.IsNull()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_WITNESS_UTXO));
            SerializeToVector(s, witness_utxo);
        }

        if (final_script_sig.empty() && final_script_witness.IsNull()) {
            // Write any partial signatures
            for (const auto& sig_pair : partial_sigs) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_PARTIAL_SIG), Span{sig_pair.second.first});
                s << sig_pair.second.second;
            }

            // Write the sighash type
            if (sighash_type != std::nullopt) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_SIGHASH));
                SerializeToVector(s, *sighash_type);
            }

            // Write the redeem script
            if (!redeem_script.empty()) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_REDEEMSCRIPT));
                s << redeem_script;
            }

            // Write the witness script
            if (!witness_script.empty()) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_WITNESSSCRIPT));
                s << witness_script;
            }

            // Write any hd keypaths
            SerializeHDKeypaths(s, hd_keypaths, CompactSizeWriter(PSBT_IN_BIP32_DERIVATION));

            // Write any ripemd160 preimage
            for (const auto& [hash, preimage] : ripemd160_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_RIPEMD160), Span{hash});
                s << preimage;
            }

            // Write any sha256 preimage
            for (const auto& [hash, preimage] : sha256_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_SHA256), Span{hash});
                s << preimage;
            }

            // Write any hash160 preimage
            for (const auto& [hash, preimage] : hash160_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_HASH160), Span{hash});
                s << preimage;
            }

            // Write any hash256 preimage
            for (const auto& [hash, preimage] : hash256_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_HASH256), Span{hash});
                s << preimage;
            }

            // Write taproot key sig
            if (!m_tap_key_sig.empty()) {
                SerializeToVector(s, PSBT_IN_TAP_KEY_SIG);
                s << m_tap_key_sig;
            }

            // Write taproot script sigs
            for (const auto& [pubkey_leaf, sig] : m_tap_script_sigs) {
                const auto& [xonly, leaf_hash] = pubkey_leaf;
                SerializeToVector(s, PSBT_IN_TAP_SCRIPT_SIG, xonly, leaf_hash);
                s << sig;
            }

            // Write taproot leaf scripts
            for (const auto& [leaf, control_blocks] : m_tap_scripts) {
                const auto& [script, leaf_ver] = leaf;
                for (const auto& control_block : control_blocks) {
                    SerializeToVector(s, PSBT_IN_TAP_LEAF_SCRIPT, Span{control_block});
                    std::vector<unsigned char> value_v(script.begin(), script.end());
                    value_v.push_back((uint8_t)leaf_ver);
                    s << value_v;
                }
            }

            // Write taproot bip32 keypaths
            for (const auto& [xonly, leaf_origin] : m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                SerializeToVector(s, PSBT_IN_TAP_BIP32_DERIVATION, xonly);
                std::vector<unsigned char> value;
                VectorWriter s_value{value, 0};
                s_value << leaf_hashes;
                SerializeKeyOrigin(s_value, origin);
                s << value;
            }

            // Write taproot internal key
            if (!m_tap_internal_key.IsNull()) {
                SerializeToVector(s, PSBT_IN_TAP_INTERNAL_KEY);
                s << ToByteVector(m_tap_internal_key);
            }

            // Write taproot merkle root
            if (!m_tap_merkle_root.IsNull()) {
                SerializeToVector(s, PSBT_IN_TAP_MERKLE_ROOT);
                SerializeToVector(s, m_tap_merkle_root);
            }
        }

        // Write script sig
        if (!final_script_sig.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_SCRIPTSIG));
            s << final_script_sig;
        }
        // write script witness
        if (!final_script_witness.IsNull()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_SCRIPTWITNESS));
            SerializeToVector(s, final_script_witness.stack);
        }

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        s << PSBT_SEPARATOR;
    }